

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuildPartialPiece
          (MessageBuilderGenerator *this,Printer *printer,int piece,int first_field)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FieldDescriptor *pFVar5;
  size_type sVar6;
  uint *puVar7;
  int index;
  int index_00;
  int index_01;
  AlphaNum *a;
  iterator iVar8;
  string_view local_1d8;
  string local_1c8;
  string_view local_1a8;
  uint local_194;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  *pbStack_190;
  int to_bitfield_1;
  int local_188;
  undefined1 local_180 [8];
  iterator __end3;
  undefined1 local_160 [8];
  iterator __begin3;
  btree_set<int,_std::less<int>,_std::allocator<int>_> *__range3;
  string local_130;
  string_view local_110;
  uint local_fc;
  ImmutableFieldGenerator *pIStack_f8;
  int to_bitfield;
  ImmutableFieldGenerator *field;
  int next;
  int bit;
  btree_set<int,_std::less<int>,_std::allocator<int>_> declared_to_bitfields;
  AlphaNum local_a0;
  string local_70;
  string local_50;
  string_view local_30;
  int local_20;
  uint local_1c;
  int first_field_local;
  int piece_local;
  Printer *printer_local;
  MessageBuilderGenerator *this_local;
  
  local_20 = first_field;
  local_1c = piece;
  _first_field_local = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "private void buildPartial$piece$($classname$ result) {\n  int from_$bit_field_name$ = $bit_field_name$;\n"
            );
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_50,this->name_resolver_,this->descriptor_);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_a0,local_1c);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_70,(lts_20250127 *)&local_a0,a);
  GetBitFieldName_abi_cxx11_
            ((string *)
             &declared_to_bitfields.
              super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
              .
              super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
              .tree_.size_,(java *)(ulong)local_1c,index);
  io::Printer::
  Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[15],std::__cxx11::string>
            (printer,local_30,(char (*) [10])0xa117a7,&local_50,(char (*) [6])"piece",&local_70,
             (char (*) [15])"bit_field_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &declared_to_bitfields.
              super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
              .
              super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
              .tree_.size_);
  std::__cxx11::string::~string
            ((string *)
             &declared_to_bitfields.
              super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
              .
              super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
              .tree_.size_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  io::Printer::Indent(_first_field_local);
  absl::lts_20250127::btree_set<int,_std::less<int>,_std::allocator<int>_>::btree_set
            ((btree_set<int,_std::less<int>,_std::allocator<int>_> *)&next);
  field._4_4_ = 0;
  field._0_4_ = local_20;
  while( true ) {
    iVar4 = (int)field;
    bVar2 = false;
    if (field._4_4_ < 0x20) {
      iVar3 = Descriptor::field_count(this->descriptor_);
      bVar2 = iVar4 < iVar3;
    }
    if (!bVar2) break;
    pFVar5 = Descriptor::field(this->descriptor_,(int)field);
    pIStack_f8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&this->field_generators_,pFVar5);
    iVar4 = (*(pIStack_f8->super_FieldGenerator)._vptr_FieldGenerator[6])();
    field._4_4_ = field._4_4_ + iVar4;
    pFVar5 = Descriptor::field(this->descriptor_,(int)field);
    bVar2 = IsRealOneof(pFVar5);
    if (!bVar2) {
      pFVar5 = Descriptor::field(this->descriptor_,(int)field);
      bVar2 = anon_unknown_10::BitfieldTracksMutability(pFVar5);
      if ((!bVar2) &&
         (iVar4 = (*(pIStack_f8->super_FieldGenerator)._vptr_FieldGenerator[6])(), iVar4 != 0)) {
        iVar4 = (*(pIStack_f8->super_FieldGenerator)._vptr_FieldGenerator[5])();
        if (0 < iVar4) {
          iVar4 = (*(pIStack_f8->super_FieldGenerator)._vptr_FieldGenerator[3])();
          if (iVar4 < 0) {
            iVar4 = iVar4 + 0x1f;
          }
          local_fc = iVar4 >> 5;
          sVar6 = absl::lts_20250127::container_internal::
                  btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                  ::count<int>((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                                *)&next,(key_arg<int> *)&local_fc);
          pPVar1 = _first_field_local;
          if (sVar6 == 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_110,"int to_$bit_field_name$ = 0;\n");
            GetBitFieldName_abi_cxx11_(&local_130,(java *)(ulong)local_fc,index_00);
            io::Printer::Print<char[15],std::__cxx11::string>
                      (pPVar1,local_110,(char (*) [15])"bit_field_name",&local_130);
            std::__cxx11::string::~string((string *)&local_130);
            absl::lts_20250127::container_internal::
            btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
            ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_bool>
                      *)&__range3,
                     (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                      *)&next,(value_type *)&local_fc);
          }
        }
        (*(pIStack_f8->super_FieldGenerator)._vptr_FieldGenerator[0xd])
                  (pIStack_f8,_first_field_local);
      }
    }
    field._0_4_ = (int)field + 1;
  }
  __begin3._8_8_ = &next;
  iVar8 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
          ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                   *)__begin3._8_8_);
  __end3._8_8_ = iVar8.node_;
  __begin3.node_._0_4_ = iVar8.position_;
  local_160 = (undefined1  [8])__end3._8_8_;
  iVar8 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
          ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                 *)__begin3._8_8_);
  pbStack_190 = iVar8.node_;
  local_188 = iVar8.position_;
  local_180 = (undefined1  [8])pbStack_190;
  __end3.node_._0_4_ = local_188;
  while (bVar2 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                 ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                               *)local_160,(iterator *)local_180), bVar2) {
    puVar7 = (uint *)absl::lts_20250127::container_internal::
                     btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                     ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                                  *)local_160);
    pPVar1 = _first_field_local;
    local_194 = *puVar7;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1a8,"result.$bit_field_name$ |= to_$bit_field_name$;\n");
    GetBitFieldName_abi_cxx11_(&local_1c8,(java *)(ulong)local_194,index_01);
    io::Printer::Print<char[15],std::__cxx11::string>
              (pPVar1,local_1a8,(char (*) [15])"bit_field_name",&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
    ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                  *)local_160);
  }
  io::Printer::Outdent(_first_field_local);
  pPVar1 = _first_field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"}\n\n");
  io::Printer::Print<>(pPVar1,local_1d8);
  iVar4 = (int)field;
  absl::lts_20250127::btree_set<int,_std::less<int>,_std::allocator<int>_>::~btree_set
            ((btree_set<int,_std::less<int>,_std::allocator<int>_> *)&next);
  return iVar4;
}

Assistant:

int MessageBuilderGenerator::GenerateBuildPartialPiece(io::Printer* printer,
                                                       int piece,
                                                       int first_field) {
  printer->Print(
      "private void buildPartial$piece$($classname$ result) {\n"
      "  int from_$bit_field_name$ = $bit_field_name$;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_), "piece",
      absl::StrCat(piece), "bit_field_name", GetBitFieldName(piece));
  printer->Indent();
  absl::btree_set<int> declared_to_bitfields;

  int bit = 0;
  int next = first_field;
  for (; bit < 32 && next < descriptor_->field_count(); ++next) {
    const ImmutableFieldGenerator& field =
        field_generators_.get(descriptor_->field(next));
    bit += field.GetNumBitsForBuilder();

    // Skip oneof fields that are handled separately
    if (IsRealOneof(descriptor_->field(next))) {
      continue;
    }

    // Skip repeated fields because they are currently handled
    // in separate buildPartial sub-methods.
    if (BitfieldTracksMutability(descriptor_->field(next))) {
      continue;
    }
    // Skip fields without presence bits in the builder
    if (field.GetNumBitsForBuilder() == 0) {
      continue;
    }

    // Track message bits if necessary
    if (field.GetNumBitsForMessage() > 0) {
      int to_bitfield = field.GetMessageBitIndex() / 32;
      if (declared_to_bitfields.count(to_bitfield) == 0) {
        printer->Print("int to_$bit_field_name$ = 0;\n", "bit_field_name",
                       GetBitFieldName(to_bitfield));
        declared_to_bitfields.insert(to_bitfield);
      }
    }

    // Copy the field from the builder to the message
    field.GenerateBuildingCode(printer);
  }

  // Copy the bit field results to the generated message
  for (int to_bitfield : declared_to_bitfields) {
    printer->Print("result.$bit_field_name$ |= to_$bit_field_name$;\n",
                   "bit_field_name", GetBitFieldName(to_bitfield));
  }

  printer->Outdent();
  printer->Print("}\n\n");

  return next;
}